

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

Vec_Ptr_t * Llb_ManFlowCompute(Aig_Man_t *p)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  Vec_Ptr_t *vMinCut;
  int iVar5;
  Aig_Obj_t *pAVar6;
  int iVar7;
  
  Aig_ManCleanData(p);
  Aig_ManIncrementTravId(p);
  iVar7 = 0;
  iVar5 = 0;
  do {
    if (p->vObjs->nSize <= iVar5) {
      Aig_ManIncrementTravId(p);
      iVar5 = 0;
      do {
        if (p->vObjs->nSize <= iVar5) {
          vMinCut = Llb_ManFlowMinCut(p);
          if (vMinCut->nSize == iVar7) {
            Llb_ManFlowUpdateCut(p,vMinCut);
            iVar5 = Llb_ManFlowVerifyCut(p,vMinCut);
            if (iVar5 == 0) {
              puts("Llb_ManFlow() error! The computed min-cut is not a cut!");
            }
            return vMinCut;
          }
          __assert_fail("Vec_PtrSize(vMinCut) == Flow",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                        ,0x373,"Vec_Ptr_t *Llb_ManFlowCompute(Aig_Man_t *)");
        }
        pvVar4 = Vec_PtrEntry(p->vObjs,iVar5);
        if (pvVar4 != (void *)0x0) {
          uVar1 = *(ulong *)((long)pvVar4 + 0x18);
          uVar3 = (uint)uVar1;
          if ((uVar1 & 0x20) != 0) {
            if ((uVar1 & 0x10) != 0) {
              __assert_fail("!pObj->fMarkA",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                            ,0x365,"Vec_Ptr_t *Llb_ManFlowCompute(Aig_Man_t *)");
            }
            pAVar6 = (Aig_Obj_t *)(*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe);
            if ((pAVar6->field_0x18 & 0x20) == 0) {
              iVar2 = Llb_ManFlowBwdPath2_rec(p,pAVar6);
              if (iVar2 != 0) {
                __assert_fail("RetValue == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                              ,0x369,"Vec_Ptr_t *Llb_ManFlowCompute(Aig_Man_t *)");
              }
              uVar3 = (uint)*(undefined8 *)((long)pvVar4 + 0x18);
            }
            if ((0xfffffffd < (uVar3 & 7) - 7) &&
               (pAVar6 = (Aig_Obj_t *)(*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe),
               (pAVar6->field_0x18 & 0x20) == 0)) {
              iVar2 = Llb_ManFlowBwdPath2_rec(p,pAVar6);
              if (iVar2 != 0) {
                __assert_fail("RetValue == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                              ,0x36e,"Vec_Ptr_t *Llb_ManFlowCompute(Aig_Man_t *)");
              }
            }
          }
        }
        iVar5 = iVar5 + 1;
      } while( true );
    }
    pvVar4 = Vec_PtrEntry(p->vObjs,iVar5);
    if ((pvVar4 != (void *)0x0) && ((*(ulong *)((long)pvVar4 + 0x18) & 0x20) != 0)) {
      if ((*(ulong *)((long)pvVar4 + 0x18) & 0x10) != 0) {
        __assert_fail("!pObj->fMarkA",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                      ,0x34b,"Vec_Ptr_t *Llb_ManFlowCompute(Aig_Man_t *)");
      }
      pAVar6 = (Aig_Obj_t *)(*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe);
      if ((pAVar6->field_0x18 & 0x20) == 0) {
        iVar2 = Llb_ManFlowBwdPath2_rec(p,pAVar6);
        iVar7 = iVar7 + iVar2;
        if (iVar2 != 0) {
          Aig_ManIncrementTravId(p);
        }
      }
      if ((0xfffffffd < (*(uint *)((long)pvVar4 + 0x18) & 7) - 7) &&
         (pAVar6 = (Aig_Obj_t *)(*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe),
         (pAVar6->field_0x18 & 0x20) == 0)) {
        iVar2 = Llb_ManFlowBwdPath2_rec(p,pAVar6);
        iVar7 = iVar7 + iVar2;
        if (iVar2 != 0) {
          Aig_ManIncrementTravId(p);
        }
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Llb_ManFlowCompute( Aig_Man_t * p )
{
    Vec_Ptr_t * vMinCut;
    Aig_Obj_t * pObj;
    int Flow, FlowCur, RetValue, i;
    // find the max-flow
    Flow = 0;
    Aig_ManCleanData( p );
    Aig_ManIncrementTravId(p);
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !pObj->fMarkB )
            continue;
        assert( !pObj->fMarkA );
        if ( !Aig_ObjFanin0(pObj)->fMarkB )
        {
//printf( "%d ", Aig_ObjFanin0(pObj)->Id );
            FlowCur  = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin0(pObj) );
            Flow    += FlowCur;
            if ( FlowCur )
                Aig_ManIncrementTravId(p);
        }
        if ( Aig_ObjIsNode(pObj) && !Aig_ObjFanin1(pObj)->fMarkB )
        {
//printf( "%d ", Aig_ObjFanin1(pObj)->Id );
            FlowCur  = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin1(pObj) );
            Flow    += FlowCur;
            if ( FlowCur )
                Aig_ManIncrementTravId(p);
        }
    }
//printf( "\n" );

    // mark the nodes reachable from the latches
    Aig_ManIncrementTravId(p);
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !pObj->fMarkB )
            continue;
        assert( !pObj->fMarkA );
        if ( !Aig_ObjFanin0(pObj)->fMarkB )
        {
            RetValue = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin0(pObj) );
            assert( RetValue == 0 );
        }
        if ( Aig_ObjIsNode(pObj) && !Aig_ObjFanin1(pObj)->fMarkB )
        {
            RetValue = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin1(pObj) );
            assert( RetValue == 0 );
        }
    }
    // find the min-cut with the smallest volume
    vMinCut = Llb_ManFlowMinCut( p );
    assert( Vec_PtrSize(vMinCut) == Flow );
//printf( "%d ", Vec_PtrSize(vMinCut) );
    Llb_ManFlowUpdateCut( p, vMinCut );
//printf( "%d   ", Vec_PtrSize(vMinCut) );
    // verify the cut
    if ( !Llb_ManFlowVerifyCut(p, vMinCut) )
        printf( "Llb_ManFlow() error! The computed min-cut is not a cut!\n" );
//    Llb_ManFlowPrintCut( p, vMinCut );
    return vMinCut;
}